

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.h
# Opt level: O2

void __thiscall HuffmanEncoder::HuffmanEncoder(HuffmanEncoder *this,string *message)

{
  _Rb_tree_header *p_Var1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__HuffmanEncoder_0010eb68;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->nodes_;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->nodes_;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node._M_size = 0;
  (this->temp_code_)._M_dataplus._M_p = (pointer)&(this->temp_code_).field_2;
  (this->temp_code_)._M_string_length = 0;
  (this->temp_code_).field_2._M_local_buf[0] = '\0';
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->table_)._M_t._M_impl.super__Rb_tree_header;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->table_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Cryptor).show_ = true;
  return;
}

Assistant:

explicit HuffmanEncoder(const std::string& message) : Cryptor(message) { set_show(true); }